

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

void __thiscall
google::protobuf::UnknownFieldSet::AddFixed32(UnknownFieldSet *this,int number,uint32 value)

{
  undefined4 in_EDX;
  undefined4 in_ESI;
  UnknownField field;
  undefined4 in_stack_ffffffffffffffec;
  
  UnknownField::SetType((UnknownField *)&stack0xffffffffffffffe0,TYPE_FIXED32);
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back((vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
             *)CONCAT44(in_ESI,in_EDX),(value_type *)CONCAT44(in_stack_ffffffffffffffec,in_EDX));
  return;
}

Assistant:

void UnknownFieldSet::AddFixed32(int number, uint32 value) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_FIXED32);
  field.data_.fixed32_ = value;
  fields_.push_back(field);
}